

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O1

string * fileContents(string *__return_storage_ptr__,string *fileName)

{
  stringstream buffer;
  ifstream file;
  string local_3a0 [4];
  ios_base local_320 [264];
  undefined1 local_218 [16];
  streambuf local_208 [504];
  
  resourcePath(local_3a0,fileName);
  std::ifstream::ifstream(local_218,(string *)local_3a0,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0[0]._M_dataplus._M_p != &local_3a0[0].field_2) {
    operator_delete(local_3a0[0]._M_dataplus._M_p,local_3a0[0].field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_3a0);
  std::ostream::operator<<(&local_3a0[0].field_2,local_208);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_3a0);
  std::ios_base::~ios_base(local_320);
  std::ifstream::~ifstream(local_218);
  return __return_storage_ptr__;
}

Assistant:

std::string fileContents(const std::string &fileName)
{
    std::ifstream file(resourcePath(fileName));
    std::stringstream buffer;

    buffer << file.rdbuf();

    return buffer.str();
}